

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

float Abc_NtkComputeFanoutLoad(Bus_Man_t *p,Vec_Ptr_t *vFanouts)

{
  Vec_Flt_t *vWireCaps;
  int iVar1;
  Abc_Obj_t *p_00;
  float fVar2;
  int local_28;
  float local_24;
  int i;
  float Load;
  Abc_Obj_t *pFanout;
  Vec_Ptr_t *vFanouts_local;
  Bus_Man_t *p_local;
  
  vWireCaps = p->vWireCaps;
  iVar1 = Vec_PtrSize(vFanouts);
  local_24 = Abc_SclFindWireLoad(vWireCaps,iVar1);
  for (local_28 = 0; iVar1 = Vec_PtrSize(vFanouts), local_28 < iVar1; local_28 = local_28 + 1) {
    p_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,local_28);
    fVar2 = Bus_SclObjCin(p_00);
    local_24 = fVar2 + local_24;
  }
  return local_24;
}

Assistant:

float Abc_NtkComputeFanoutLoad( Bus_Man_t * p, Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pFanout;
    float Load;
    int i;
    Load = Abc_SclFindWireLoad( p->vWireCaps, Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
        Load += Bus_SclObjCin( pFanout );
    return Load;
}